

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O2

void __thiscall bandit::reporter::xunit::test_run_complete(xunit *this)

{
  long lVar1;
  ostream *poVar2;
  string local_38;
  
  std::operator<<(this->stm_,"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n");
  poVar2 = std::operator<<(this->stm_,"<testsuite name=\"bandit\" tests=\"");
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)poVar2,(this->super_progress_base).specs_run_);
  poVar2 = std::operator<<(poVar2,"\" errors=\"0\" failures=\"");
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)poVar2,(this->super_progress_base).specs_failed_);
  std::operator<<(poVar2,"\"");
  if (0 < (this->super_progress_base).specs_skipped_) {
    poVar2 = std::operator<<(this->stm_," skipped=\"");
    poVar2 = (ostream *)
             std::ostream::operator<<((ostream *)poVar2,(this->super_progress_base).specs_skipped_);
    std::operator<<(poVar2,"\"");
  }
  lVar1 = (this->testsuite_runtime_).__r;
  poVar2 = std::operator<<(this->stm_," time=\"");
  std::__cxx11::to_string(&local_38,(double)lVar1 / 1000000000.0);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::operator<<(poVar2,"\">\n");
  std::__cxx11::string::~string((string *)&local_38);
  poVar2 = this->stm_;
  std::__cxx11::stringbuf::str();
  std::operator<<(poVar2,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator<<(this->stm_,"</testsuite>\n");
  return;
}

Assistant:

void test_run_complete() override {
        stm_ << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n";
        stm_ << "<testsuite name=\"bandit\" tests=\"" << specs_run_ << "\" errors=\"0\" failures=\""
             << specs_failed_ << "\"";

        if (specs_skipped_ > 0) {
          stm_ << " skipped=\"" << specs_skipped_ << "\"";
        }

        std::chrono::duration<double> dur_in_sec(testsuite_runtime_);
        stm_ << " time=\"" << std::to_string(dur_in_sec.count()) << "\">\n";

        stm_ << work_stm_.str();

        stm_ << "</testsuite>\n";
      }